

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O2

void print_values(longlong byte_offset,size_t bit_offset,size_t bits_available)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"byte offset = ");
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"bit offset = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"bits available = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
print_values(long long byte_offset, size_t bit_offset, size_t bits_available)
{
    std::cout << "byte offset = " << byte_offset << ", " << "bit offset = " << bit_offset << ", "
              << "bits available = " << bits_available << std::endl;
}